

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O1

bool rprog_unset(ROOM_INDEX_DATA *room,char *progtype,char *name)

{
  RPROG_DATA *pRVar1;
  bool bVar2;
  char **ppcVar3;
  int i;
  long lVar4;
  ulong uVar5;
  
  ppcVar3 = &rprog_table[0].name;
  lVar4 = 0;
  do {
    bVar2 = str_cmp(*ppcVar3,name);
    if (!bVar2) goto LAB_003046e1;
    lVar4 = lVar4 + 1;
    ppcVar3 = ppcVar3 + 4;
  } while (lVar4 != 0x11);
  lVar4 = 0x11;
LAB_003046e1:
  if ((int)lVar4 != 0x11) {
    bVar2 = str_cmp(progtype,"pulse_prog");
    if (bVar2) {
      bVar2 = str_cmp(progtype,"entry_prog");
      if (bVar2) {
        bVar2 = str_cmp(progtype,"move_prog");
        if (bVar2) {
          bVar2 = str_cmp(progtype,"drop_prog");
          if (bVar2) {
            bVar2 = str_cmp(progtype,"speech_prog");
            if (bVar2) {
              bVar2 = str_cmp(progtype,"open_prog");
              if (bVar2) goto LAB_0030482c;
              pRVar1 = room->rprogs;
              pRVar1->open_prog = (RPROG_FUN_OPEN *)0x0;
              ppcVar3 = &pRVar1->open_name;
              uVar5 = 0xffffffffffffffdf;
            }
            else {
              pRVar1 = room->rprogs;
              pRVar1->speech_prog = (RPROG_FUN_SPEECH *)0x0;
              ppcVar3 = &pRVar1->speech_name;
              uVar5 = 0xffffffffffffffef;
            }
          }
          else {
            pRVar1 = room->rprogs;
            pRVar1->drop_prog = (RPROG_FUN_DROP *)0x0;
            ppcVar3 = &pRVar1->drop_name;
            uVar5 = 0xfffffffffffffff7;
          }
        }
        else {
          pRVar1 = room->rprogs;
          pRVar1->move_prog = (RPROG_FUN_MOVE *)0x0;
          ppcVar3 = &pRVar1->move_name;
          uVar5 = 0xfffffffffffffffb;
        }
      }
      else {
        pRVar1 = room->rprogs;
        pRVar1->entry_prog = (RPROG_FUN_ENTRY *)0x0;
        ppcVar3 = &pRVar1->entry_name;
        uVar5 = 0xfffffffffffffffd;
      }
    }
    else {
      pRVar1 = room->rprogs;
      pRVar1->pulse_prog = (RPROG_FUN_PULSE *)0x0;
      ppcVar3 = &pRVar1->pulse_name;
      uVar5 = 0xfffffffffffffffe;
    }
    free_pstring(*ppcVar3);
    room->progtypes[0] = room->progtypes[0] & uVar5;
  }
LAB_0030482c:
  return (int)lVar4 != 0x11;
}

Assistant:

bool rprog_unset(ROOM_INDEX_DATA *room, const char *progtype, const char *name)
{
	int i;
	for (i = 0; rprog_table[i].name; i++)
	{
		if (!str_cmp(rprog_table[i].name, name))
			break;
	}

	if (!rprog_table[i].name)
		return false;

	// IF YOU ADD A NEW TYPE ALSO PUT IT IN DB.C DO_ADUMP
	if (!str_cmp(progtype, "pulse_prog"))
	{
		room->rprogs->pulse_prog = nullptr;
		free_pstring(room->rprogs->pulse_name);
		REMOVE_BIT(room->progtypes, RPROG_PULSE);
	}
	else if (!str_cmp(progtype, "entry_prog"))
	{
		room->rprogs->entry_prog = nullptr;
		free_pstring(room->rprogs->entry_name);
		REMOVE_BIT(room->progtypes, RPROG_ENTRY);
	}
	else if (!str_cmp(progtype, "move_prog"))
	{
		room->rprogs->move_prog = nullptr;
		free_pstring(room->rprogs->move_name);
		REMOVE_BIT(room->progtypes, RPROG_MOVE);
	}
	else if (!str_cmp(progtype, "drop_prog"))
	{
		room->rprogs->drop_prog = nullptr;
		free_pstring(room->rprogs->drop_name);
		REMOVE_BIT(room->progtypes, RPROG_DROP);
	}
	else if (!str_cmp(progtype, "speech_prog"))
	{
		room->rprogs->speech_prog = nullptr;
		free_pstring(room->rprogs->speech_name);
		REMOVE_BIT(room->progtypes, RPROG_SPEECH);
	}
	else if (!str_cmp(progtype, "open_prog"))
	{
		room->rprogs->open_prog = nullptr;
		free_pstring(room->rprogs->open_name);
		REMOVE_BIT(room->progtypes, RPROG_OPEN);
	}

	return true;
}